

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cast.cpp
# Opt level: O1

bool duckdb::StructToVarcharCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  data_ptr_t pdVar2;
  char (*pacVar3) [4];
  unsigned_long *puVar4;
  bool bVar5;
  byte bVar6;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  Vector *vector;
  reference pvVar7;
  pointer pVVar8;
  type pVVar9;
  type pVVar10;
  const_reference pvVar11;
  idx_t iVar12;
  long lVar13;
  ulong uVar14;
  uint *idx;
  uint *extraout_RDX;
  char *pcVar15;
  uint *len;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  code *pcVar16;
  long lVar17;
  size_type sVar18;
  Vector *pVVar19;
  undefined1 auVar20 [16];
  anon_struct_16_3_d7536bce_for_pointer aVar21;
  Vector varchar_struct;
  anon_union_16_2_67f50693_for_value local_128;
  Vector *local_118;
  ulong local_110;
  void *local_108;
  void *local_100;
  uint *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  data_ptr_t local_e8;
  child_list_t<LogicalType> *local_e0;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_d8;
  char *local_d0;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_c8;
  ulong local_c0;
  ulong local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  VVar1 = source->vector_type;
  local_118 = result;
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  LogicalType::LogicalType(&local_b0,(LogicalType *)((parameters->cast_data).ptr + 4));
  Vector::Vector(&local_98,&local_b0,count);
  LogicalType::~LogicalType(&local_b0);
  StructToStructCast(source,&local_98,count,parameters);
  local_d8 = StructVector::GetEntries(source);
  Vector::Flatten(&local_98,count);
  bVar5 = StructType::IsUnnamed(&source->type);
  local_e0 = StructType::GetChildTypes_abi_cxx11_(&source->type);
  this = StructVector::GetEntries(&local_98);
  FlatVector::VerifyFlatVector(&local_98);
  local_e8 = local_118->data;
  local_108 = operator_new__((long)(this->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_100 = operator_new__((long)(this->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (count != 0) {
    local_ec = 0x7b;
    if (bVar5) {
      local_ec = 0x28;
    }
    local_f0 = 0x7d;
    if (bVar5) {
      local_f0 = 0x29;
    }
    idx = (uint *)0x0;
    len = extraout_RDX;
    local_f8 = (uint *)count;
    local_c8 = this;
    do {
      if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         (len = idx,
         (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
          [(ulong)idx >> 6] >> ((ulong)idx & 0x3f) & 1) != 0)) {
        if ((this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          vector = (Vector *)0x2;
        }
        else {
          local_110 = (ulong)idx >> 6;
          vector = (Vector *)0x2;
          sVar18 = 0;
          do {
            pVVar19 = (Vector *)&vector->field_0x2;
            if (sVar18 == 0) {
              pVVar19 = vector;
            }
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](local_d8,sVar18);
            pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(pvVar7);
            bVar6 = (pVVar8->type).physical_type_ - LIST;
            pcVar16 = VectorCastHelpers::CalculateEscapedStringLength<false>;
            if (bVar6 < 7) {
              pcVar16 = (code *)(&PTR_CalculateStringLength_019b23c0)[bVar6];
            }
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar18);
            pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(pvVar7);
            Vector::Flatten(pVVar8,(idx_t)local_f8);
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar18);
            pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator*(pvVar7);
            FlatVector::VerifyFlatVector(pVVar9);
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar18);
            pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar7);
            pdVar2 = pVVar10->data;
            pvVar11 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                      ::operator[](local_e0,sVar18);
            if (!bVar5) {
              pacVar3 = (char (*) [4])(pvVar11->first)._M_dataplus._M_p;
              local_128.pointer.length = (uint32_t)(pvVar11->first)._M_string_length;
              if (local_128.pointer.length < 0xd) {
                local_128._12_4_ = 0;
                local_128.pointer.prefix[0] = '\0';
                local_128.pointer.prefix[1] = '\0';
                local_128.pointer.prefix[2] = '\0';
                local_128.pointer.prefix[3] = '\0';
                local_128._8_4_ = 0;
                if (local_128.pointer.length != 0) {
                  switchD_00b1422a::default
                            (local_128.pointer.prefix,pacVar3,
                             (ulong)(local_128.pointer.length & 0xf));
                }
              }
              else {
                local_128.pointer.prefix = *pacVar3;
                local_128._8_4_ = SUB84(pacVar3,0);
                local_128._12_4_ = (undefined4)((ulong)pacVar3 >> 0x20);
              }
              iVar12 = VectorCastHelpers::CalculateEscapedStringLength<true>
                                 ((string_t *)&local_128.pointer,(bool *)((long)local_108 + sVar18))
              ;
              pVVar19 = (Vector *)(&pVVar19->field_0x2 + iVar12);
            }
            puVar4 = (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar4 == (unsigned_long *)0x0) ||
               ((puVar4[local_110] & 1L << ((byte)idx & 0x3f)) != 0)) {
              auVar20 = (*pcVar16)(pdVar2 + (long)idx * 0x10,(long)local_100 + sVar18);
            }
            else {
              auVar20._8_8_ = local_110;
              auVar20._0_8_ = 4;
            }
            len = auVar20._8_8_;
            vector = (Vector *)(&pVVar19->vector_type + auVar20._0_8_);
            sVar18 = sVar18 + 1;
          } while (sVar18 < (ulong)((long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        aVar21 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString((StringVector *)local_118,vector,(idx_t)len);
        local_110 = (long)idx * 0x10;
        local_d0 = (((anon_union_16_2_67f50693_for_value *)(local_e8 + local_110))->pointer).prefix;
        ((anon_union_16_2_67f50693_for_value *)(local_e8 + local_110))->pointer = aVar21;
        pcVar15 = aVar21.ptr;
        if (aVar21.length < 0xd) {
          pcVar15 = local_d0;
        }
        *pcVar15 = (char)local_ec;
        if ((this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar17 = 1;
        }
        else {
          local_b8 = (ulong)idx >> 6;
          lVar17 = 1;
          local_c0 = 1L << ((byte)idx & 0x3f);
          sVar18 = 0;
          do {
            if (sVar18 != 0) {
              (pcVar15 + lVar17)[0] = ',';
              (pcVar15 + lVar17)[1] = ' ';
              lVar17 = lVar17 + 2;
            }
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](local_d8,sVar18);
            pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(pvVar7);
            bVar6 = (pVVar8->type).physical_type_ - LIST;
            pcVar16 = VectorCastHelpers::WriteEscapedString<false>;
            if (bVar6 < 7) {
              pcVar16 = (code *)(&PTR_WriteString_019b23f8)[bVar6];
            }
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar18);
            pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator*(pvVar7);
            FlatVector::VerifyFlatVector(pVVar9);
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar18);
            pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar7);
            pdVar2 = pVVar10->data;
            if (!bVar5) {
              pvVar11 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                        ::operator[](local_e0,sVar18);
              pacVar3 = (char (*) [4])(pvVar11->first)._M_dataplus._M_p;
              local_128.pointer.length = (uint32_t)(pvVar11->first)._M_string_length;
              if (local_128.pointer.length < 0xd) {
                local_128._12_4_ = 0;
                local_128.pointer.prefix[0] = '\0';
                local_128.pointer.prefix[1] = '\0';
                local_128.pointer.prefix[2] = '\0';
                local_128.pointer.prefix[3] = '\0';
                local_128._8_4_ = 0;
                if (local_128.pointer.length != 0) {
                  switchD_00b1422a::default
                            (local_128.pointer.prefix,pacVar3,
                             (ulong)(local_128.pointer.length & 0xf));
                }
              }
              else {
                local_128.pointer.prefix = *pacVar3;
                local_128._8_4_ = SUB84(pacVar3,0);
                local_128._12_4_ = (undefined4)((ulong)pacVar3 >> 0x20);
              }
              iVar12 = VectorCastHelpers::WriteEscapedString<true>
                                 (pcVar15 + lVar17,(string_t *)&local_128.pointer,
                                  *(bool *)((long)local_108 + sVar18));
              (pcVar15 + iVar12 + lVar17)[0] = ':';
              (pcVar15 + iVar12 + lVar17)[1] = ' ';
              lVar17 = lVar17 + iVar12 + 2;
              this = local_c8;
            }
            puVar4 = (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[local_b8] & local_c0) != 0)) {
              lVar13 = (*pcVar16)(pcVar15 + lVar17,pdVar2 + local_110,
                                  *(undefined1 *)((long)local_100 + sVar18));
            }
            else {
              builtin_strncpy(pcVar15 + lVar17,"NULL",4);
              lVar13 = 4;
            }
            lVar17 = lVar13 + lVar17;
            sVar18 = sVar18 + 1;
          } while (sVar18 < (ulong)((long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        count = (idx_t)local_f8;
        len = (uint *)(local_e8 + local_110);
        pcVar15[lVar17] = (char)local_f0;
        uVar14 = (ulong)*len;
        if (uVar14 < 0xd) {
          switchD_005700f1::default(local_d0 + uVar14,0,0xc - uVar14);
          len = extraout_RDX_00;
        }
        else {
          len[1] = **(uint **)(len + 2);
        }
      }
      else {
        FlatVector::SetNull(local_118,(idx_t)idx,true);
        len = extraout_RDX_01;
      }
      idx = (uint *)((long)idx + 1);
    } while (idx != (uint *)count);
  }
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(local_118,CONSTANT_VECTOR);
  }
  operator_delete__(local_100);
  operator_delete__(local_108);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return true;
}

Assistant:

static bool StructToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// first cast all child elements to varchar
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	Vector varchar_struct(cast_data.target, count);
	StructToStructCast(source, varchar_struct, count, parameters);
	auto &base_children = StructVector::GetEntries(source);

	// now construct the actual varchar vector
	varchar_struct.Flatten(count);
	bool is_unnamed = StructType::IsUnnamed(source.GetType());
	auto &child_types = StructType::GetChildTypes(source.GetType());
	auto &children = StructVector::GetEntries(varchar_struct);
	auto &validity = FlatVector::Validity(varchar_struct);
	auto result_data = FlatVector::GetData<string_t>(result);
	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NAME_SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;
	auto key_needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(children.size());
	auto value_needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(children.size());

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		//! Calculate the total length of the row
		idx_t string_length = 2; // {}
		for (idx_t c = 0; c < children.size(); c++) {
			if (c > 0) {
				string_length += SEP_LENGTH;
			}
			auto add_escapes = !base_children[c]->GetType().IsNested();
			auto string_length_func = add_escapes ? VectorCastHelpers::CalculateEscapedStringLength<false>
			                                      : VectorCastHelpers::CalculateStringLength;

			children[c]->Flatten(count);
			auto &child_validity = FlatVector::Validity(*children[c]);
			auto data = FlatVector::GetData<string_t>(*children[c]);
			auto &name = child_types[c].first;
			if (!is_unnamed) {
				string_length += VectorCastHelpers::CalculateEscapedStringLength<true>(name, key_needs_quotes[c]);
				string_length += NAME_SEP_LENGTH; // ": "
			}
			if (child_validity.RowIsValid(i)) {
				//! Skip the `\`, not a special character outside quotes
				string_length += string_length_func(data[i], value_needs_quotes[c]);
			} else {
				string_length += NULL_LENGTH;
			}
		}

		result_data[i] = StringVector::EmptyString(result, string_length);
		auto dataptr = result_data[i].GetDataWriteable();

		//! Serialize the struct to the string
		idx_t offset = 0;
		dataptr[offset++] = is_unnamed ? '(' : '{';
		for (idx_t c = 0; c < children.size(); c++) {
			if (c > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			auto add_escapes = !base_children[c]->GetType().IsNested();
			auto write_string_func =
			    add_escapes ? VectorCastHelpers::WriteEscapedString<false> : VectorCastHelpers::WriteString;

			auto &child_validity = FlatVector::Validity(*children[c]);
			auto data = FlatVector::GetData<string_t>(*children[c]);
			if (!is_unnamed) {
				auto &name = child_types[c].first;
				// "{<name>: <value>}"
				offset += VectorCastHelpers::WriteEscapedString<true>(dataptr + offset, name, key_needs_quotes[c]);
				dataptr[offset++] = ':';
				dataptr[offset++] = ' ';
			}
			// value
			if (child_validity.RowIsValid(i)) {
				//! Skip the `\`, not a special character outside quotes
				offset += write_string_func(dataptr + offset, data[i], value_needs_quotes[c]);
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset++] = is_unnamed ? ')' : '}';
		result_data[i].Finalize();
	}

	if (constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	return true;
}